

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::SPFMethod::selectMolecule(SPFMethod *this)

{
  bool bVar1;
  shared_ptr<OpenMD::SPFData> spfData;
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  __shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  Snapshot::getSPFData((Snapshot *)local_90);
  this->spfTarget_ = (this->super_RNEMD).particleTarget_;
  if (*(int *)(local_90._0_8_ + 0x20) == -1) {
    std::__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> *)local_90);
    bVar1 = setSelectedMolecule(this,(shared_ptr<OpenMD::SPFData> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    if (!bVar1) {
      this->failedLastTrial_ = true;
      bVar1 = false;
      goto LAB_001f08bd;
    }
  }
  else {
    std::__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> *)local_90);
    getSelectedMolecule(this,(shared_ptr<OpenMD::SPFData> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  std::__cxx11::to_string(&local_40,*(int *)(local_90._0_8_ + 0x20));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_90 + 0x10),"select ",&local_40);
  std::__cxx11::string::operator=((string *)&this->selectedMoleculeStr_,(string *)(local_90 + 0x10))
  ;
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  std::__cxx11::string::~string((string *)&local_40);
  SelectionEvaluator::loadScriptString
            (&this->selectedMoleculeEvaluator_,&this->selectedMoleculeStr_);
  SelectionEvaluator::evaluate((SelectionSet *)(local_90 + 0x10),&this->selectedMoleculeEvaluator_);
  SelectionManager::setSelectionSet(&this->selectedMoleculeMan_,(SelectionSet *)(local_90 + 0x10));
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
             (local_90 + 0x10));
  bVar1 = true;
LAB_001f08bd:
  this->forceManager_->hasSelectedMolecule_ = bVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  return;
}

Assistant:

void SPFMethod::selectMolecule() {
    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    // Always reset spfTarget_ before selecting a new particle
    spfTarget_ = particleTarget_;

    bool hasSelectedMolecule = (spfData->globalID == -1) ?
                                   setSelectedMolecule(spfData) :
                                   getSelectedMolecule(spfData);

    if (hasSelectedMolecule) {
      selectedMoleculeStr_ = "select " + std::to_string(spfData->globalID);

      selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
      selectedMoleculeMan_.setSelectionSet(
          selectedMoleculeEvaluator_.evaluate());

#ifdef IS_MPI
      MPI_Bcast(&spfTarget_, 1, MPI_REALTYPE,
                info_->getMolToProc(spfData->globalID), MPI_COMM_WORLD);
#endif
    } else {
      failedLastTrial_ = true;
    }

    forceManager_->setHasSelectedMolecule(hasSelectedMolecule);
  }